

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O0

int32_t __thiscall
icu_63::CollationDataBuilder::getCEs
          (CollationDataBuilder *this,UnicodeString *prefix,UnicodeString *s,int64_t *ces,
          int32_t cesLength)

{
  UnicodeString local_78;
  int32_t local_38;
  int32_t local_34;
  int32_t prefixLength;
  int32_t cesLength_local;
  int64_t *ces_local;
  UnicodeString *s_local;
  UnicodeString *prefix_local;
  CollationDataBuilder *this_local;
  
  local_34 = cesLength;
  _prefixLength = ces;
  ces_local = (int64_t *)s;
  s_local = prefix;
  prefix_local = (UnicodeString *)this;
  local_38 = UnicodeString::length(prefix);
  if (local_38 == 0) {
    this_local._4_4_ = getCEs(this,(UnicodeString *)ces_local,0,_prefixLength,local_34);
  }
  else {
    operator+(&local_78,s_local,(UnicodeString *)ces_local);
    this_local._4_4_ = getCEs(this,&local_78,local_38,_prefixLength,local_34);
    UnicodeString::~UnicodeString(&local_78);
  }
  return this_local._4_4_;
}

Assistant:

int32_t
CollationDataBuilder::getCEs(const UnicodeString &prefix, const UnicodeString &s,
                             int64_t ces[], int32_t cesLength) {
    int32_t prefixLength = prefix.length();
    if(prefixLength == 0) {
        return getCEs(s, 0, ces, cesLength);
    } else {
        return getCEs(prefix + s, prefixLength, ces, cesLength);
    }
}